

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cpp
# Opt level: O0

void __thiscall duration_invalid_Test::duration_invalid_Test(duration_invalid_Test *this)

{
  duration_invalid_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__duration_invalid_Test_00818c08;
  return;
}

Assistant:

TEST(duration, invalid) {
	EXPECT_EQ(duration_from_string("Jessica was here"sv).duration.count(),0);
	EXPECT_EQ(duration_from_string("and here"sv).duration.count(),0);
	EXPECT_EQ(duration_from_string("second guessing code"sv).duration.count(),0);
	EXPECT_EQ(duration_from_string("year round"sv).duration.count(),0);

	EXPECT_EQ(duration_from_string("1yr 3 da 4 mi invalid 77 months"sv).duration.count(),
		to_seconds(years{1} + days{3}).count()); // "4 mi" is actually valid, but is rounded down to zero on conversion
}